

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::ByteBufferGetter
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type,string *bb_var_name)

{
  BaseType *type_00;
  char *pcVar1;
  string *this_00;
  allocator<char> local_c1;
  undefined1 local_c0 [32];
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  switch(type->base_type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    pcVar1 = ".get";
    break;
  case BASE_TYPE_BOOL:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "0.toByte() != ",bb_var_name);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   ".get");
    goto LAB_001908ea;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
    pcVar1 = ".getShort";
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
    pcVar1 = ".getInt";
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
    pcVar1 = ".getLong";
    break;
  case BASE_TYPE_FLOAT:
    pcVar1 = ".getFloat";
    break;
  case BASE_TYPE_DOUBLE:
    pcVar1 = ".getDouble";
    break;
  case BASE_TYPE_STRING:
    pcVar1 = "__string";
    goto LAB_00190856;
  case BASE_TYPE_VECTOR:
    local_c0._0_4_ = type->element;
    local_c0._24_2_ = type->fixed_length;
    local_c0._4_4_ = BASE_TYPE_NONE;
    local_c0._8_8_ = type->struct_def;
    local_c0._16_8_ = type->enum_def;
    std::__cxx11::string::string((string *)&local_40,(string *)bb_var_name);
    ByteBufferGetter(__return_storage_ptr__,this,(Type *)local_c0,&local_40);
    this_00 = &local_40;
    goto LAB_001908ef;
  case BASE_TYPE_STRUCT:
    pcVar1 = "__struct";
    goto LAB_00190856;
  case BASE_TYPE_UNION:
    pcVar1 = "__union";
LAB_00190856:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1,(allocator<char> *)local_c0);
    return __return_storage_ptr__;
  default:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   bb_var_name,".");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"get",&local_c1);
    GenTypeBasic_abi_cxx11_(&local_a0,(KotlinGenerator *)type,type_00);
    Namer::Method(&local_60,&(this->namer_).super_Namer,&local_80,&local_a0);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
LAB_001908ea:
    this_00 = (string *)local_c0;
LAB_001908ef:
    std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
  std::operator+(__return_storage_ptr__,bb_var_name,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ByteBufferGetter(const Type &type,
                               std::string bb_var_name) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__string";
      case BASE_TYPE_STRUCT: return "__struct";
      case BASE_TYPE_UNION: return "__union";
      case BASE_TYPE_VECTOR:
        return ByteBufferGetter(type.VectorType(), bb_var_name);
      case BASE_TYPE_INT:
      case BASE_TYPE_UINT: return bb_var_name + ".getInt";
      case BASE_TYPE_SHORT:
      case BASE_TYPE_USHORT: return bb_var_name + ".getShort";
      case BASE_TYPE_ULONG:
      case BASE_TYPE_LONG: return bb_var_name + ".getLong";
      case BASE_TYPE_FLOAT: return bb_var_name + ".getFloat";
      case BASE_TYPE_DOUBLE: return bb_var_name + ".getDouble";
      case BASE_TYPE_CHAR:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return bb_var_name + ".get";
      case BASE_TYPE_BOOL: return "0.toByte() != " + bb_var_name + ".get";
      default:
        return bb_var_name + "." +
               namer_.Method("get", GenTypeBasic(type.base_type));
    }
  }